

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::ICULCPTranscoder::transcode
          (ICULCPTranscoder *this,char *toTranscode,XMLCh *toFill,XMLSize_t maxChars,
          MemoryManager *manager)

{
  bool bVar1;
  size_t sVar2;
  UErrorCode err;
  XMLMutexLock lockConverter;
  int local_3c;
  XMLMutexLock local_38;
  
  if ((toTranscode == (char *)0x0 || maxChars == 0) || (*toTranscode == '\0')) {
    *toFill = L'\0';
    bVar1 = true;
  }
  else {
    sVar2 = strlen(toTranscode);
    local_3c = 0;
    XMLMutexLock::XMLMutexLock(&local_38,&this->fMutex);
    ucnv_toUChars_70(this->fConverter,toFill,(int)maxChars + 1,toTranscode,sVar2 & 0xffffffff,
                     &local_3c);
    XMLMutexLock::~XMLMutexLock(&local_38);
    bVar1 = local_3c < 1;
  }
  return bVar1;
}

Assistant:

bool ICULCPTranscoder::transcode(const  char* const     toTranscode
                                ,       XMLCh* const    toFill
                                , const XMLSize_t       maxChars
                                , MemoryManager* const  manager)
{
    // Check for a couple of psycho corner cases
    if (!toTranscode || !maxChars)
    {
        toFill[0] = 0;
        return true;
    }

    if (!*toTranscode)
    {
        toFill[0] = 0;
        return true;
    }

    // We'll need this in a couple of places below
    const XMLSize_t srcLen = strlen(toTranscode);

    //
    //  Set up the target buffer. If XMLCh and UChar are not the same size
    //  then we have to use a temp buffer and convert over.
    //
    UChar* targetBuf;
    if (sizeof(XMLCh) == sizeof(UChar))
        targetBuf = (UChar*)toFill;
    else
        targetBuf = (UChar*) manager->allocate
        (
            (maxChars + 1) * sizeof(UChar)
        );//new UChar[maxChars + 1];

    //
    //  Use a faux block to enforce a lock on the converter, which will
    //  unlock immediately after its completed.
    //
    UErrorCode err = U_ZERO_ERROR;
    {
        XMLMutexLock lockConverter(&fMutex);
        ucnv_toUChars
        (
            fConverter
            , targetBuf
            , (int32_t)maxChars + 1
            , toTranscode
            , (int32_t)srcLen
            , &err
        );
    }

    if (U_FAILURE(err))
    {
        if (targetBuf != (UChar*)toFill)
            manager->deallocate(targetBuf);//delete [] targetBuf;
        return false;
    }

    // If the sizes are not the same, then copy the data over
    if (sizeof(XMLCh) != sizeof(UChar))
    {
        UChar* srcPtr = targetBuf;
        XMLCh* outPtr = toFill;
        while (*srcPtr)
            *outPtr++ = XMLCh(*srcPtr++);
        *outPtr = 0;

        // And delete the temp buffer
        manager->deallocate(targetBuf);//delete [] targetBuf;
    }

    return true;
}